

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

char * stbi_zlib_decode_noheader_malloc(char *buffer,int len,int *outlen)

{
  int iVar1;
  char *obuf;
  char *p;
  zbuf a;
  int *outlen_local;
  int len_local;
  char *buffer_local;
  
  a._4088_8_ = outlen;
  obuf = (char *)malloc(0x4000);
  if (obuf == (char *)0x0) {
    buffer_local = (char *)0x0;
  }
  else {
    a.zbuffer = (uint8 *)(buffer + len);
    p = buffer;
    iVar1 = do_zlib((zbuf *)&p,obuf,0x4000,1,0);
    if (iVar1 == 0) {
      free(a.zout);
      buffer_local = (char *)0x0;
    }
    else {
      if (a._4088_8_ != 0) {
        *(int *)a._4088_8_ = a.num_bits - (int)a.zout;
      }
      buffer_local = a.zout;
    }
  }
  return buffer_local;
}

Assistant:

char *stbi_zlib_decode_noheader_malloc(char const *buffer, int len, int *outlen)
{
   zbuf a;
   char *p = (char *) malloc(16384);
   if (p == NULL) return NULL;
   a.zbuffer = (uint8 *) buffer;
   a.zbuffer_end = (uint8 *) buffer+len;
   if (do_zlib(&a, p, 16384, 1, 0)) {
      if (outlen) *outlen = (int) (a.zout - a.zout_start);
      return a.zout_start;
   } else {
      free(a.zout_start);
      return NULL;
   }
}